

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O0

int kvtree_lock_open_read(char *file,int *fd,kvtree *hash)

{
  mode_t mode;
  int iVar1;
  mode_t mode_file;
  kvtree *hash_local;
  int *fd_local;
  char *file_local;
  
  if (fd == (int *)0x0) {
    kvtree_err("Must provide a pointer to an int to return opened file descriptor @ %s:%d",
               "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
               ,0x63d);
    file_local._4_4_ = 1;
  }
  else {
    *fd = -1;
    if (file == (char *)0x0) {
      kvtree_err("No filename specified @ %s:%d",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                 ,0x649);
      file_local._4_4_ = 1;
    }
    else if (hash == (kvtree *)0x0) {
      kvtree_err("No hash provided to read data into @ %s:%d",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                 ,0x651);
      file_local._4_4_ = 1;
    }
    else {
      mode = kvtree_getmode(1,1,0);
      iVar1 = kvtree_open_with_lock(file,0x42,mode,1);
      *fd = iVar1;
      if (*fd < 0) {
        file_local._4_4_ = 1;
      }
      else {
        kvtree_read_fd(file,*fd,hash);
        file_local._4_4_ = 0;
      }
    }
  }
  return file_local._4_4_;
}

Assistant:

int kvtree_lock_open_read(const char* file, int* fd, kvtree* hash)
{
  /* check that we got a pointer to a file descriptor */
  if (fd == NULL) {
    kvtree_err("Must provide a pointer to an int to return opened file descriptor @ %s:%d",
      __FILE__, __LINE__
    );
    return KVTREE_FAILURE;
  }

  /* we at least got a pointer to a file descriptor,
   * initialize it to -1 */
  *fd = -1;

  /* check that we got a filename */
  if (file == NULL) {
    kvtree_err("No filename specified @ %s:%d",
      __FILE__, __LINE__
    );
    return KVTREE_FAILURE;
  }

  /* check that we got a hash to read data into */
  if (hash == NULL) {
    kvtree_err("No hash provided to read data into @ %s:%d",
      __FILE__, __LINE__
    );
    return KVTREE_FAILURE;
  }

  /* open file with lock for read / write access */
  mode_t mode_file = kvtree_getmode(1, 1, 0);

  /*
   * NOTE: even though this function is kvtree_lock_open_read(), we still
   * take a write lock below since our code uses it for a read-modify-write.
   */
  *fd = kvtree_open_with_lock(file, O_RDWR | O_CREAT, mode_file, 1);
  if (*fd >= 0) {
    /* read the file into the hash */
    kvtree_read_fd(file, *fd, hash);
    return KVTREE_SUCCESS;
  }

  return KVTREE_FAILURE;
}